

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O3

TranslationBlock_conflict *
tb_gen_code_mips(CPUState *cpu,target_ulong_conflict pc,target_ulong_conflict cs_base,uint32_t flags
                ,int cflags)

{
  undefined4 uVar1;
  TCGContext_conflict6 *s;
  TCGContext_conflict6 *pTVar2;
  byte *pbVar3;
  uc_struct *uc;
  uintptr_t uVar4;
  long *plVar5;
  PageDesc *pPVar6;
  uint uVar7;
  TranslationBlock *tb;
  ulong extraout_RAX;
  void *pvVar8;
  byte *pbVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  tb_page_addr_t tVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  tb_page_addr_t phys2;
  TranslationBlock *pTVar17;
  PageDesc *p2;
  PageDesc *p;
  PageDesc *local_88;
  uint local_80;
  undefined4 uStack_7c;
  tb_page_addr_t local_78;
  void *local_70;
  uint32_t local_64;
  target_ulong_conflict local_60;
  uint32_t local_5c;
  ulong local_58;
  CPUArchState_conflict5 *local_50;
  byte *local_48;
  CPUState *local_40;
  TranslationBlock *local_38;
  
  s = cpu->uc->tcg_ctx;
  local_50 = (CPUArchState_conflict5 *)cpu->env_ptr;
  local_60 = cs_base;
  local_5c = flags;
  local_78 = get_page_addr_code_mips(local_50,pc);
  uVar14 = cflags | 0x10000;
  if (local_78 != 0xffffffffffffffff) {
    uVar14 = cflags;
  }
  uVar7 = cpu->cluster_index;
  iVar11 = cpu->singlestep_enabled;
  tb = tcg_tb_alloc_mips((TCGContext_conflict3 *)s);
  pTVar17 = (TranslationBlock *)(ulong)uVar7;
  if (tb == (TranslationBlock *)0x0) {
LAB_00742385:
    tb_gen_code_mips_cold_2();
    tb = pTVar17;
LAB_0074238f:
    tb_page_remove((PageDesc *)CONCAT44(uStack_7c,local_80),(TranslationBlock_conflict *)tb);
    lVar10 = CONCAT44(uStack_7c,local_80);
    g_free(*(gpointer *)(lVar10 + 8));
    *(undefined8 *)(lVar10 + 8) = 0;
    *(undefined4 *)(lVar10 + 0x10) = 0;
    if (local_88 != (PageDesc *)0x0) {
      tb_page_remove(local_88,(TranslationBlock_conflict *)tb);
      pPVar6 = local_88;
      g_free(local_88->code_bitmap);
      pPVar6->code_bitmap = (unsigned_long *)0x0;
      pPVar6->code_write_count = 0;
    }
    if (local_38 == tb) {
LAB_00742367:
      tcg_tb_insert_mips((TCGContext_conflict3 *)s,tb);
    }
    else {
      lVar10 = (long)((uc_struct_conflict4 *)s->gen_insn_data[0x107][2])->qemu_icache_linesize;
      s->code_gen_ptr = (void *)((long)local_70 - (-lVar10 & lVar10 + 0x97U));
      tb = local_38;
    }
    return (TranslationBlock_conflict *)tb;
  }
  local_64 = uVar7 << 0x18 | uVar14 & 0xffffff;
  uVar14 = uVar14 & 0x7fff;
  uVar7 = 0x200;
  if (uVar14 < 0x200) {
    uVar7 = uVar14;
  }
  if (uVar14 == 0) {
    uVar7 = 0x200;
  }
  uVar14 = 1;
  if (iVar11 == 0) {
    uVar14 = uVar7;
  }
  local_40 = (CPUState *)(local_50[-4].tcs[0xd].mmr + 5);
  local_58 = (ulong)pc;
LAB_00741ea3:
  local_70 = s->code_gen_ptr;
  *(void **)&tb->cflags = local_70;
  *(int *)&tb->pc = (int)local_58;
  *(target_ulong_conflict *)((long)&tb->pc + 4) = local_60;
  *(uint32_t *)&tb->cs_base = local_5c;
  tb->flags = local_64;
  (tb->tc).size = 0;
  uVar1 = (undefined4)cpu->trace_dstate[0];
  tb->size = (short)uVar1;
  tb->icount = (short)((uint)uVar1 >> 0x10);
  s->tb_cflags = local_64;
  uVar7 = uVar14;
  do {
    uVar14 = uVar7;
    tcg_func_start_mips((TCGContext_conflict3 *)s);
    s->cpu = local_40;
    gen_intermediate_code_mips(cpu,(TranslationBlock_conflict *)tb,uVar14);
    s->cpu = (CPUState *)0x0;
    *(undefined4 *)(tb->page_addr + 1) = 0xffffffff;
    s->tb_jmp_reset_offset = (uint16_t *)(tb->page_addr + 1);
    s->tb_jmp_insn_offset = (uintptr_t *)tb->jmp_reset_offset;
    s->tb_jmp_target_addr = (uintptr_t *)0x0;
    uVar7 = tcg_gen_code_mips((TCGContext_conflict3 *)s,tb);
    if (-1 < (int)uVar7) {
      pvVar8 = (void *)(ulong)uVar7;
      local_48 = (byte *)((long)local_70 + (long)pvVar8);
      uVar12 = (ulong)*(ushort *)((long)&tb->cs_base + 6);
      pbVar9 = local_48;
      if (uVar12 == 0) goto LAB_007420ba;
      pTVar2 = cpu->uc->tcg_ctx;
      pbVar3 = (byte *)pTVar2->code_gen_highwater;
      uVar16 = 0;
      goto LAB_00741fcd;
    }
    tb_gen_code_mips_cold_1();
    uVar7 = local_80;
  } while ((extraout_RAX & 1) == 0);
  goto LAB_00741f65;
  while (uVar16 = uVar16 + 1, uVar16 != uVar12) {
LAB_00741fcd:
    lVar10 = 0;
    do {
      if (uVar16 == 0) {
        iVar11 = 0;
        if (lVar10 == 0) {
          iVar11 = (int)tb->pc;
        }
      }
      else {
        iVar11 = *(int *)((long)(pTVar2->gen_insn_data + -1) + (uVar16 * 6 + lVar10 * 2 + 6) * 2);
      }
      uVar7 = *(int *)((long)pTVar2->gen_insn_data[0] + lVar10 * 4 + uVar16 * 0xc) - iVar11;
      while ((0x3f < uVar7 && (((int)uVar7 >> 7 == 0xffffffffU & (byte)((uVar7 & 0x40) >> 6)) == 0))
            ) {
        *pbVar9 = (byte)uVar7 | 0x80;
        pbVar9 = pbVar9 + 1;
        uVar7 = (int)uVar7 >> 7;
      }
      *pbVar9 = (byte)uVar7 & 0x7f;
      pbVar9 = pbVar9 + 1;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    if (uVar16 == 0) {
      uVar7 = 0;
    }
    else {
      uVar7 = (uint)pTVar2->gen_insn_end_off[uVar16 - 1];
    }
    uVar7 = pTVar2->gen_insn_end_off[uVar16] - uVar7;
    while ((0x3f < uVar7 && (((int)uVar7 >> 7 == 0xffffffffU & (byte)((uVar7 & 0x40) >> 6)) == 0)))
    {
      *pbVar9 = (byte)uVar7 | 0x80;
      pbVar9 = pbVar9 + 1;
      uVar7 = (int)uVar7 >> 7;
    }
    *pbVar9 = (byte)uVar7 & 0x7f;
    pbVar9 = pbVar9 + 1;
    if (pbVar3 < pbVar9) goto LAB_00741f65;
  }
LAB_007420ba:
  uVar7 = (int)pbVar9 - (int)local_48;
  if (-1 < (int)uVar7) {
    (tb->tc).ptr = pvVar8;
    s->code_gen_ptr =
         (void *)((long)local_70 + (long)pvVar8 + (ulong)(uVar7 & 0x7fffffff) + 0xf &
                 0xfffffffffffffff0);
    tb->jmp_list_next[0] = 0;
    tb->jmp_list_next[1] = 0;
    *(undefined1 (*) [16])(tb->jmp_target_arg + 1) = (undefined1  [16])0x0;
    tb->jmp_dest[0] = 0;
    uVar12 = (ulong)(ushort)tb->page_addr[1];
    if (uVar12 != 0xffff) {
      tb_set_jmp_target_mips(tb,0,uVar12 + *(long *)&tb->cflags);
    }
    uVar12 = local_58;
    tVar13 = local_78;
    uVar16 = (ulong)*(ushort *)((long)tb->page_addr + 10);
    if (uVar16 != 0xffff) {
      tb_set_jmp_target_mips(tb,1,uVar16 + *(long *)&tb->cflags);
    }
    uVar14 = ((uint)uVar12 + (uint)*(ushort *)((long)&tb->cs_base + 4)) - 1 & 0xfffff000;
    phys2 = 0xffffffffffffffff;
    if (((uint)uVar12 & 0xfffff000) != uVar14) {
      phys2 = get_page_addr_code_mips(local_50,uVar14);
    }
    uc = (uc_struct *)cpu->uc;
    local_88 = (PageDesc *)0x0;
    if (tVar13 == 0xffffffffffffffff) {
      if ((tb->flags & 0x10000) == 0) {
        __assert_fail("tb->cflags & CF_NOCACHE",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                      ,0x66c,
                      "TranslationBlock *tb_link_page(struct uc_struct *, TranslationBlock *, tb_page_addr_t, tb_page_addr_t)"
                     );
      }
      *(undefined4 *)(tb->page_next + 1) = 0xffffffff;
      *(undefined4 *)((long)tb->page_next + 0xc) = 0xffffffff;
      *(undefined4 *)tb->page_addr = 0xffffffff;
      *(undefined4 *)((long)tb->page_addr + 4) = 0xffffffff;
      goto LAB_00742367;
    }
    page_lock_pair((uc_struct_conflict4 *)uc,(PageDesc **)&local_80,tVar13,&local_88,phys2,1);
    plVar5 = (long *)CONCAT44(uStack_7c,local_80);
    uVar12 = (ulong)((uint)tVar13 & 0xfffff000);
    tb->page_next[1] = uVar12;
    pTVar17 = (TranslationBlock *)*plVar5;
    tb->orig_tb = pTVar17;
    *plVar5 = (long)tb;
    g_free((gpointer)plVar5[1]);
    plVar5[1] = 0;
    *(undefined4 *)(plVar5 + 2) = 0;
    if (pTVar17 == (TranslationBlock *)0x0) {
      tlb_protect_code_mips((uc_struct_conflict4 *)uc,uVar12);
    }
    pPVar6 = local_88;
    if (local_88 == (PageDesc *)0x0) {
      tb->page_addr[0] = 0xffffffffffffffff;
      tVar13 = local_78;
    }
    else {
      tb->page_addr[0] = phys2;
      uVar4 = local_88->first_tb;
      tb->page_next[0] = uVar4;
      local_88->first_tb = (ulong)tb | 1;
      g_free(local_88->code_bitmap);
      tVar13 = local_78;
      pPVar6->code_bitmap = (unsigned_long *)0x0;
      pPVar6->code_write_count = 0;
      if (uVar4 == 0) {
        tlb_protect_code_mips((uc_struct_conflict4 *)uc,phys2);
      }
    }
    if ((tb->flags >> 0x10 & 1) != 0) goto LAB_00742367;
    local_38 = (TranslationBlock *)0x0;
    uVar14 = (int)tVar13 * -0x7a143589 + 0x24234429;
    uVar7 = uVar14 * 0x2000 | uVar14 >> 0x13;
    uVar14 = (int)(tVar13 >> 0x20) * -0x7a143589 + 0x85ebca78;
    uVar14 = uVar14 * 0x2000 | uVar14 >> 0x13;
    uVar15 = (int)tb->pc * -0x7a143589 + 1;
    uVar15 = uVar15 * 0x2000 | uVar15 >> 0x13;
    uVar14 = (uVar15 * 0x779b1000 | uVar15 * -0x61c8864f >> 0x14) +
             (int)tb->cs_base * -0x3d4d51c3 +
             (uVar7 * 0x3c6ef362 | (uint)((int)(uVar7 * -0x61c8864f) < 0)) +
             (uVar14 * 0x1bbcd880 | uVar14 * -0x61c8864f >> 0x19) + 0x91a7a6fd;
    uVar14 = (tb->flags & 0xff0affff) * -0x3d4d51c3 +
             (uVar14 * 0x20000 | uVar14 >> 0xf) * 0x27d4eb2f;
    uVar14 = *(int *)&tb->size * -0x3d4d51c3 + (uVar14 * 0x20000 | uVar14 >> 0xf) * 0x27d4eb2f;
    uVar14 = (uVar14 * 0x20000 | uVar14 >> 0xf) * 0x27d4eb2f;
    uVar14 = (uVar14 >> 0xf ^ uVar14) * -0x7a143589;
    uVar14 = (uVar14 >> 0xd ^ uVar14) * -0x3d4d51c3;
    uVar14 = uVar14 >> 0x10 ^ uVar14;
    *(uint *)(tb->jmp_dest + 1) = uVar14;
    qht_insert(uc,(qht *)(uc->tcg_ctx->gen_insn_data + 0x180),tb,uVar14,&local_38);
    if (local_38 == (TranslationBlock *)0x0) goto LAB_00742367;
    goto LAB_0074238f;
  }
LAB_00741f65:
  tb = tcg_tb_alloc_mips((TCGContext_conflict3 *)s);
  pTVar17 = tb;
  if (tb == (TranslationBlock *)0x0) goto LAB_00742385;
  goto LAB_00741ea3;
}

Assistant:

TranslationBlock *tb_gen_code(CPUState *cpu,
                              target_ulong pc, target_ulong cs_base,
                              uint32_t flags, int cflags)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    TCGContext *tcg_ctx = cpu->uc->tcg_ctx;
    CPUArchState *env = cpu->env_ptr;
    TranslationBlock *tb, *existing_tb;
    tb_page_addr_t phys_pc, phys_page2;
    target_ulong virt_page2;
    tcg_insn_unit *gen_code_buf;
    int gen_code_size, search_size, max_insns;

    assert_memory_lock();
#ifdef HAVE_PTHREAD_JIT_PROTECT
    tb_exec_unlock(tcg_ctx);
#endif
    phys_pc = get_page_addr_code(env, pc);

    if (phys_pc == -1) {
        /* Generate a temporary TB; do not cache */
        cflags |= CF_NOCACHE;
    }

    cflags &= ~CF_CLUSTER_MASK;
    cflags |= ((uint32_t)cpu->cluster_index) << CF_CLUSTER_SHIFT;

    max_insns = cflags & CF_COUNT_MASK;
    if (max_insns == 0) {
        max_insns = CF_COUNT_MASK;
    }
    if (max_insns > TCG_MAX_INSNS) {
        max_insns = TCG_MAX_INSNS;
    }
    if (cpu->singlestep_enabled) {
        max_insns = 1;
    }

 buffer_overflow:
    tb = tcg_tb_alloc(tcg_ctx);
    if (unlikely(!tb)) {
        /* flush must be done */
        tb_flush(cpu);
        mmap_unlock();
        /* Make the execution loop process the flush as soon as possible.  */
        cpu->exception_index = EXCP_INTERRUPT;
        cpu_loop_exit(cpu);
    }

    gen_code_buf = tcg_ctx->code_gen_ptr;
    tb->tc.ptr = gen_code_buf;
    tb->pc = pc;
    tb->cs_base = cs_base;
    tb->flags = flags;
    tb->cflags = cflags;
    tb->orig_tb = NULL;
    tb->trace_vcpu_dstate = *cpu->trace_dstate;
    tcg_ctx->tb_cflags = cflags;
 tb_overflow:

    tcg_func_start(tcg_ctx);

    tcg_ctx->cpu = env_cpu(env);
    UC_TRACE_START(UC_TRACE_TB_TRANS);
    gen_intermediate_code(cpu, tb, max_insns);
    UC_TRACE_END(UC_TRACE_TB_TRANS, "[uc] translate tb 0x%" PRIx64 ": ", tb->pc);
    tcg_ctx->cpu = NULL;

    /* generate machine code */
    tb->jmp_reset_offset[0] = TB_JMP_RESET_OFFSET_INVALID;
    tb->jmp_reset_offset[1] = TB_JMP_RESET_OFFSET_INVALID;
    tcg_ctx->tb_jmp_reset_offset = tb->jmp_reset_offset;
    if (TCG_TARGET_HAS_direct_jump) {
        tcg_ctx->tb_jmp_insn_offset = tb->jmp_target_arg;
        tcg_ctx->tb_jmp_target_addr = NULL;
    } else {
        tcg_ctx->tb_jmp_insn_offset = NULL;
        tcg_ctx->tb_jmp_target_addr = tb->jmp_target_arg;
    }

    gen_code_size = tcg_gen_code(tcg_ctx, tb);
    if (unlikely(gen_code_size < 0)) {
        switch (gen_code_size) {
        case -1:
            /*
             * Overflow of code_gen_buffer, or the current slice of it.
             *
             * TODO: We don't need to re-do gen_intermediate_code, nor
             * should we re-do the tcg optimization currently hidden
             * inside tcg_gen_code.  All that should be required is to
             * flush the TBs, allocate a new TB, re-initialize it per
             * above, and re-do the actual code generation.
             */
            goto buffer_overflow;

        case -2:
            /*
             * The code generated for the TranslationBlock is too large.
             * The maximum size allowed by the unwind info is 64k.
             * There may be stricter constraints from relocations
             * in the tcg backend.
             *
             * Try again with half as many insns as we attempted this time.
             * If a single insn overflows, there's a bug somewhere...
             */
            max_insns = tb->icount;
            assert(max_insns > 1);
            max_insns /= 2;
            goto tb_overflow;

        default:
            g_assert_not_reached();
        }
    }
    search_size = encode_search(cpu->uc, tb, (uint8_t *)gen_code_buf + gen_code_size);
    if (unlikely(search_size < 0)) {
        goto buffer_overflow;
    }
    tb->tc.size = gen_code_size;

    tcg_ctx->code_gen_ptr = (void *)
        ROUND_UP((uintptr_t)gen_code_buf + gen_code_size + search_size,
                 CODE_GEN_ALIGN);

    /* init jump list */
    tb->jmp_list_head = (uintptr_t)NULL;
    tb->jmp_list_next[0] = (uintptr_t)NULL;
    tb->jmp_list_next[1] = (uintptr_t)NULL;
    tb->jmp_dest[0] = (uintptr_t)NULL;
    tb->jmp_dest[1] = (uintptr_t)NULL;

    /* init original jump addresses which have been set during tcg_gen_code() */
    if (tb->jmp_reset_offset[0] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 0);
    }
    if (tb->jmp_reset_offset[1] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 1);
    }

    /* check next page if needed */
    virt_page2 = (pc + tb->size - 1) & TARGET_PAGE_MASK;
    phys_page2 = -1;
    if ((pc & TARGET_PAGE_MASK) != virt_page2) {
        phys_page2 = get_page_addr_code(env, virt_page2);
    }
    /*
     * No explicit memory barrier is required -- tb_link_page() makes the
     * TB visible in a consistent state.
     */
    existing_tb = tb_link_page(cpu->uc, tb, phys_pc, phys_page2);
    /* if the TB already exists, discard what we just translated */
    if (unlikely(existing_tb != tb)) {
        uintptr_t orig_aligned = (uintptr_t)gen_code_buf;

        orig_aligned -= ROUND_UP(sizeof(*tb), tcg_ctx->uc->qemu_icache_linesize);
        tcg_ctx->code_gen_ptr = (void *)orig_aligned;
        return existing_tb;
    }
    tcg_tb_insert(tcg_ctx, tb);
    return tb;
}